

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_comp_fixup(jit_State *J,BCIns *pc,int cond)

{
  uint uVar1;
  SnapShot *pSVar2;
  ulong *puVar3;
  long local_50;
  uint64_t pcbase;
  SnapEntry *flink;
  SnapShot *snap;
  BCIns *npc;
  BCIns jmpins;
  int cond_local;
  BCIns *pc_local;
  jit_State *J_local;
  
  uVar1 = pc[1];
  if (cond == 0) {
    local_50 = 0;
  }
  else {
    local_50 = (ulong)(uVar1 >> 0x10) - 0x8000;
  }
  pSVar2 = (J->cur).snap + (int)((J->cur).nsnap - 1);
  puVar3 = (ulong *)((J->cur).snapmap + (pSVar2->mapofs + (uint)pSVar2->nent));
  *puVar3 = *puVar3 & 0xff | (long)(pc + local_50 + 2) * 0x100;
  J->needsnap = '\x01';
  if ((uVar1 >> 8 & 0xff) < J->maxslot) {
    J->maxslot = uVar1 >> 8 & 0xff;
  }
  lj_snap_shrink(J);
  return;
}

Assistant:

static void rec_comp_fixup(jit_State *J, const BCIns *pc, int cond)
{
  BCIns jmpins = pc[1];
  const BCIns *npc = pc + 2 + (cond ? bc_j(jmpins) : 0);
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  /* Set PC to opposite target to avoid re-recording the comp. in side trace. */
#if LJ_FR2
  SnapEntry *flink = &J->cur.snapmap[snap->mapofs + snap->nent];
  uint64_t pcbase;
  memcpy(&pcbase, flink, sizeof(uint64_t));
  pcbase = (pcbase & 0xff) | (u64ptr(npc) << 8);
  memcpy(flink, &pcbase, sizeof(uint64_t));
#else
  J->cur.snapmap[snap->mapofs + snap->nent] = SNAP_MKPC(npc);
#endif
  J->needsnap = 1;
  if (bc_a(jmpins) < J->maxslot) J->maxslot = bc_a(jmpins);
  lj_snap_shrink(J);  /* Shrink last snapshot if possible. */
}